

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PFloat::ReadValue(PFloat *this,FArchive *ar,void *addr)

{
  uint uVar1;
  BYTE tag;
  undefined4 local_38;
  undefined4 uStack_34;
  byte local_29;
  double local_28;
  
  FArchive::operator<<(ar,&local_29);
  switch(local_29) {
  case 0:
    FArchive::operator<<(ar,(BYTE *)&local_38);
    uVar1 = (uint)(char)(byte)local_38;
    goto LAB_00448dca;
  case 1:
    FArchive::operator<<(ar,(BYTE *)&local_38);
    uVar1 = (uint)(byte)local_38;
    goto LAB_00448dca;
  case 2:
    FArchive::operator<<(ar,(WORD *)&local_38);
    uVar1 = (uint)CONCAT11(local_38._1_1_,(byte)local_38);
    goto LAB_00448dca;
  case 3:
    FArchive::operator<<(ar,(WORD *)&local_38);
    uVar1 = (uint)CONCAT11(local_38._1_1_,(byte)local_38);
LAB_00448dca:
    local_28 = (double)(int)uVar1;
    break;
  case 4:
    FArchive::operator<<(ar,&local_38);
    local_28 = (double)CONCAT22(local_38._2_2_,CONCAT11(local_38._1_1_,(byte)local_38));
    break;
  case 5:
    FArchive::operator<<(ar,&local_38);
    local_28 = (double)CONCAT22(local_38._2_2_,CONCAT11(local_38._1_1_,(byte)local_38));
    break;
  case 6:
    FArchive::operator<<(ar,(QWORD *)&local_38);
    local_28 = (double)CONCAT44(uStack_34,
                                CONCAT22(local_38._2_2_,CONCAT11(local_38._1_1_,(byte)local_38)));
    break;
  case 7:
    FArchive::operator<<(ar,(QWORD *)&local_38);
    local_28 = ((double)CONCAT44(0x45300000,uStack_34) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 CONCAT22(local_38._2_2_,CONCAT11(local_38._1_1_,(byte)local_38))) -
               4503599627370496.0);
    break;
  case 8:
    local_28 = 0.0;
    break;
  case 9:
    local_28 = 1.0;
    break;
  case 10:
    FArchive::operator<<(ar,(float *)&local_38);
    local_28 = (double)(float)CONCAT22(local_38._2_2_,CONCAT11(local_38._1_1_,(byte)local_38));
    break;
  case 0xb:
    FArchive::operator<<(ar,&local_28);
    break;
  default:
    PType::SkipValue(ar,(uint)local_29);
    return false;
  }
  if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 4) {
    *(float *)addr = (float)local_28;
  }
  else {
    *(double *)addr = local_28;
  }
  return true;
}

Assistant:

bool PFloat::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	double val;
	if (ReadValueDbl(ar, &val, tag))
	{
		if (Size == 4)
		{
			*(float *)addr = (float)val;
		}
		else
		{
			*(double *)addr = val;
		}
		return true;
	}
	return false;
}